

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi.c
# Opt level: O2

void reset_bracket_type(BidiContext *ctx,size_t c,BidiType t)

{
  BidiType *pBVar1;
  size_t *psVar2;
  ulong uVar3;
  size_t sVar4;
  
  pBVar1 = ctx->types;
  psVar2 = ctx->irs;
  uVar3 = ctx->irslen;
  sVar4 = psVar2[c];
  do {
    pBVar1[sVar4] = t;
    do {
      c = c + 1;
      if (uVar3 <= c) {
        return;
      }
      sVar4 = psVar2[c];
    } while (ctx->origTypes[sVar4] == BN);
  } while (ctx->origTypes[sVar4] == NSM);
  return;
}

Assistant:

static void reset_bracket_type(BidiContext *ctx, size_t c, BidiType t)
{
    /* Final bullet point of rule N0: when we change the type of a
     * bracket, the same change applies to any contiguous sequence of
     * characters after it whose _original_ bidi type was NSM. */
    do {
        ctx->types[ctx->irs[c++]] = t;

#ifndef REMOVE_FORMATTING_CHARS
        while (c < ctx->irslen && ctx->origTypes[ctx->irs[c]] == BN) {
            /* Section 5.2 adjustment: skip past BN in the process. */
            c++;
        }
#endif
    } while (c < ctx->irslen && ctx->origTypes[ctx->irs[c]] == NSM);
}